

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O3

int lws_finalize_http_header(lws *wsi,uchar **p,uchar *end)

{
  uchar *puVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((wsi->role_ops != &role_ops_h2) && ((wsi->wsistate & 0xf000000) != 0x1000000)) {
    puVar1 = *p;
    iVar2 = 1;
    if (2 < (long)end - (long)puVar1) {
      *p = puVar1 + 1;
      *puVar1 = '\r';
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = '\n';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int lws_finalize_http_header(struct lws *wsi, unsigned char **p,
			     unsigned char *end)
{
#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi))
		return 0;
#else
	(void)wsi;
#endif
	if ((lws_intptr_t)(end - *p) < 3)
		return 1;
	*((*p)++) = '\x0d';
	*((*p)++) = '\x0a';

	return 0;
}